

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementLog.cpp
# Opt level: O3

void __thiscall Rml::Debugger::ElementLog::AddLogMessage(ElementLog *this,Type type,String *message)

{
  char *pcVar1;
  iterator __position;
  ElementDocument *pEVar2;
  string *psVar3;
  LogMessageList *this_00;
  LogMessage log_message;
  Variant local_a8;
  undefined8 local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = &this->log_types[type].log_messages;
  __position._M_current =
       (this_00->
       super__Vector_base<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>
       )._M_impl.super__Vector_impl_data._M_start;
  if (0x31 < (ulong)(((long)this->log_types[type].log_messages.
                            super__Vector_base<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current
                     >> 3) * -0x3333333333333333)) {
    std::
    vector<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>
    ::_M_erase(this_00,__position);
  }
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_58._0_4_ = this->current_index;
  this->current_index = local_58._0_4_ + 1;
  local_50._M_p = (pointer)&local_40;
  Rml::StringUtilities::EncodeRml((string *)&local_a8);
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_a8);
  pcVar1 = local_a8.data + 8;
  if ((char *)local_a8.type != pcVar1) {
    operator_delete((void *)local_a8.type,local_a8.data._8_8_ + 1);
  }
  std::
  vector<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>
  ::push_back(this_00,(value_type *)local_58);
  if (this->log_types[type].visible == false) {
    if (this->log_types[type].button_name._M_string_length != 0) {
      psVar3 = (string *)Rml::Element::GetElementById((string *)this);
      if (psVar3 != (string *)0x0) {
        local_a8.type = (Type)pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Off*","");
        Rml::Element::SetInnerRML(psVar3);
        if ((char *)local_a8.type != pcVar1) {
          operator_delete((void *)local_a8.type,local_a8.data._8_8_ + 1);
        }
      }
    }
  }
  else {
    pEVar2 = this->beacon;
    if ((pEVar2 != (ElementDocument *)0x0) && ((int)type < this->current_beacon_level)) {
      local_a8.type = NONE;
      Rml::Variant::Set((int)&local_a8);
      local_80 = 0xffffffff00000001;
      local_78 = 0;
      local_70 = 0xffffffff;
      local_68 = 0;
      p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Rml::Element::SetProperty((PropertyId)pEVar2,(Property *)0x2a);
      if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
      }
      Rml::Variant::~Variant(&local_a8);
      this->current_beacon_level = type;
      psVar3 = (string *)Rml::Element::GetFirstChild();
      if (psVar3 != (string *)0x0) {
        Rml::Element::SetClassNames(psVar3);
        Rml::Element::SetInnerRML(psVar3);
      }
      Rml::ElementDocument::UpdateDocument();
    }
  }
  this->dirty_logs = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ElementLog::AddLogMessage(Log::Type type, const String& message)
{
	LogMessageList& log_message_list = log_types[type].log_messages;
	if (log_message_list.size() >= MAX_LOG_MESSAGES)
	{
		log_message_list.erase(log_message_list.begin());
	}

	// Add the message to the list of messages for the specified log type.
	LogMessage log_message;
	log_message.index = current_index++;
	log_message.message = StringUtilities::EncodeRml(message);
	log_message_list.push_back(log_message);

	// If this log type is invisible, and there is a button for this log type, then change its text from
	// "Off" to "Off*" to signal that there are unread logs.
	if (!log_types[type].visible)
	{
		if (!log_types[type].button_name.empty())
		{
			Element* button = GetElementById(log_types[type].button_name);
			if (button)
			{
				button->SetInnerRML("Off*");
			}
		}
	}
	// Trigger the beacon if we're hidden. Override any lower-level log type if it is already visible.
	else
	{
		if (beacon != nullptr)
		{
			if (type < current_beacon_level)
			{
				beacon->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));

				current_beacon_level = type;
				Element* beacon_button = beacon->GetFirstChild();
				if (beacon_button)
				{
					beacon_button->SetClassNames(log_types[type].class_name);
					beacon_button->SetInnerRML(log_types[type].alert_contents);
				}

				// We need to update the document manually in case the beacon appears during context update.
				beacon->UpdateDocument();
			}
		}
	}

	// Force a refresh of the RML.
	dirty_logs = true;
}